

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
* __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::getInterfaceConn
          (pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
           *__return_storage_ptr__,PortConnectionBuilder *this,ASTContext *context,
          InterfacePortSymbol *port,ExpressionSyntax *syntax)

{
  size_t sVar1;
  size_t __n;
  __extent_storage<18446744073709551615UL> _Var2;
  pointer pCVar3;
  Scope *this_00;
  span<const_slang::ConstantRange,_18446744073709551615UL> portDims_00;
  DeferredSourceRange sourceRange;
  span<const_slang::ConstantRange,_18446744073709551615UL> left;
  span<const_slang::ConstantRange,_18446744073709551615UL> right;
  pointer pCVar4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  Type *this_01;
  DefinitionSymbol *this_02;
  Diagnostic *pDVar8;
  Diagnostic *pDVar9;
  ModportSymbol *pMVar10;
  Symbol *pSVar11;
  char *pcVar12;
  size_t sVar13;
  size_t sVar14;
  ulong uVar15;
  __extent_storage<18446744073709551615UL> _Var16;
  InstanceArraySymbol *array;
  SourceRange SVar17;
  span<const_slang::ConstantRange,_18446744073709551615UL> right_00;
  span<const_slang::ConstantRange,_18446744073709551615UL> right_01;
  string_view arg;
  span<const_slang::ConstantRange,_18446744073709551615UL> left_00;
  span<const_slang::ConstantRange,_18446744073709551615UL> left_01;
  ModportSymbol *modport;
  Expression *expr;
  anon_class_40_5_9960d2bb makeResult;
  optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> portDims;
  SmallVector<slang::ConstantRange,_4UL> dims;
  ModportSymbol *local_e0;
  Expression *local_d8;
  undefined1 local_d0 [32];
  Expression **local_b0;
  __extent_storage<18446744073709551615UL> local_a8;
  pointer local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ExpressionSyntax *local_88;
  _Storage<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true> local_80;
  char local_70;
  SmallVectorBase<slang::ConstantRange> local_68;
  
  InterfacePortSymbol::getDeclaredRange
            ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *)
             &local_80._M_value,port);
  if (((local_70 == '\0') ||
      (local_d8 = Expression::tryBindInterfaceRef(context,syntax,true),
      local_d8 == (Expression *)0x0)) || (bVar6 = Expression::bad(local_d8), bVar6)) {
    (__return_storage_ptr__->first).first = (Symbol *)0x0;
    (__return_storage_ptr__->first).second = (ModportSymbol *)0x0;
    __return_storage_ptr__->second = (Expression *)0x0;
    return __return_storage_ptr__;
  }
  local_68.data_ = (pointer)local_68.firstElement;
  local_68.len = 0;
  local_68.cap = 4;
  this_01 = (local_d8->type).ptr;
  while (bVar6 = Type::isUnpackedArray(this_01), bVar6) {
    local_d0._0_8_ = Type::getFixedRange(this_01);
    SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange>
              (&local_68,(ConstantRange *)local_d0);
    this_01 = Type::getArrayElementType(this_01);
  }
  this_02 = InstanceSymbol::getDefinition(*(InstanceSymbol **)&this_01[1].super_Symbol);
  if ((this_02 == port->interfaceDef) || (port->isGeneric != false)) {
    local_e0 = (ModportSymbol *)this_01[1].super_Symbol.name._M_len;
    sVar1 = (port->modport)._M_len;
    pMVar10 = local_e0;
    if (sVar1 != 0) {
      if ((local_e0 != (ModportSymbol *)0x0) &&
         ((__n = (local_e0->super_Symbol).name._M_len, __n != sVar1 ||
          ((__n != 0 &&
           (iVar7 = bcmp((local_e0->super_Symbol).name._M_str,(port->modport)._M_str,__n),
           iVar7 != 0)))))) {
        SVar17 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
        pDVar8 = ASTContext::addDiag(context,(DiagCode)0x820006,SVar17);
        pDVar9 = Diagnostic::operator<<(pDVar8,(this_02->super_Symbol).name);
        Diagnostic::operator<<(pDVar9,(local_e0->super_Symbol).name);
        if (port->isGeneric == false) {
          sVar14 = (port->interfaceDef->super_Symbol).name._M_len;
          pcVar12 = (port->interfaceDef->super_Symbol).name._M_str;
        }
        else {
          pcVar12 = "interface";
          sVar14 = 9;
        }
        arg._M_str = pcVar12;
        arg._M_len = sVar14;
        Diagnostic::operator<<(pDVar8,arg);
        Diagnostic::operator<<(pDVar8,port->modport);
        goto LAB_0037d161;
      }
      local_98 = 0;
      uStack_90 = 0;
      sourceRange.node.value = (uintptr_t)syntax;
      sourceRange.range = (SourceRange)ZEXT816(0);
      local_88 = syntax;
      pMVar10 = InterfacePortSymbol::getModport
                          (port,context,*(InstanceSymbol **)&this_01[1].super_Symbol,sourceRange);
      if (pMVar10 == (ModportSymbol *)0x0) {
        (__return_storage_ptr__->first).first = (Symbol *)0x0;
        (__return_storage_ptr__->first).second = (ModportSymbol *)0x0;
        __return_storage_ptr__->second = (Expression *)0x0;
        goto LAB_0037d16f;
      }
    }
    local_e0 = pMVar10;
    sVar5 = local_68.len;
    pCVar4 = local_68.data_;
    local_d0._24_8_ = &local_e0;
    local_b0 = &local_d8;
    pSVar11 = *(Symbol **)(local_d8 + 1);
    left._M_extent._M_extent_value = (size_t)local_80._M_value._M_extent._M_extent_value;
    left._M_ptr = local_80._M_value._M_ptr;
    right._M_extent._M_extent_value = local_68.len;
    right._M_ptr = local_68.data_;
    local_a0 = local_80._M_value._M_ptr;
    local_a8._M_extent_value = (size_t)local_80._M_value._M_extent._M_extent_value;
    local_d0._0_8_ = this;
    local_d0._8_8_ = port;
    local_d0._16_8_ = &local_80;
    bVar6 = areDimSizesEqual(left,right);
    if (bVar6) {
      portDims_00._M_extent._M_extent_value = (size_t)local_80._M_value._M_extent._M_extent_value;
      portDims_00._M_ptr = local_80._M_value._M_ptr;
      pSVar11 = rewireIfaceArrayIndices
                          (this,pSVar11,(port->super_Symbol).name,(port->super_Symbol).location,
                           portDims_00);
      (__return_storage_ptr__->first).first = pSVar11;
      (__return_storage_ptr__->first).second = local_e0;
      __return_storage_ptr__->second = local_d8;
      goto LAB_0037d16f;
    }
    _Var2._M_extent_value = (this->instanceDims).super_SmallVectorBase<slang::ConstantRange>.len;
    if (_Var2._M_extent_value <= sVar5) {
      _Var16._M_extent_value = sVar5;
      if (_Var2._M_extent_value != 0xffffffffffffffff) {
        _Var16._M_extent_value = _Var2._M_extent_value;
      }
      pCVar3 = (this->instanceDims).super_SmallVectorBase<slang::ConstantRange>.data_;
      right_00._M_extent._M_extent_value = _Var2._M_extent_value;
      right_00._M_ptr = pCVar3;
      left_00._M_extent._M_extent_value = _Var16._M_extent_value;
      left_00._M_ptr = pCVar4;
      bVar6 = areDimSizesEqual(left_00,right_00);
      if ((bVar6) &&
         (left_01._M_ptr = pCVar4 + _Var2._M_extent_value,
         right_01._M_extent._M_extent_value = local_a8._M_extent_value, right_01._M_ptr = local_a0,
         left_01._M_extent._M_extent_value = sVar5 - _Var2._M_extent_value,
         bVar6 = areDimSizesEqual(left_01,right_01), bVar6)) {
        sVar14 = (this->instance->super_InstanceSymbolBase).arrayPath._M_extent._M_extent_value;
        if (sVar14 != 0) {
          sVar13 = 0;
          do {
            uVar15 = (ulong)(this->instance->super_InstanceSymbolBase).arrayPath._M_ptr[sVar13];
            if (pCVar3[sVar13].right <= pCVar3[sVar13].left !=
                *(int *)((long)&pSVar11[2].name._M_len + 4) <= (int)pSVar11[2].name._M_len) {
              uVar15 = ~uVar15 + *(long *)(pSVar11 + 2);
            }
            pSVar11 = *(Symbol **)(&(pSVar11[1].originatingSyntax)->kind + uVar15 * 2);
            sVar13 = sVar13 + 1;
          } while (sVar14 != sVar13);
        }
        getInterfaceConn::anon_class_40_5_9960d2bb::operator()
                  (__return_storage_ptr__,(anon_class_40_5_9960d2bb *)local_d0,pSVar11);
        goto LAB_0037d16f;
      }
    }
    this_00 = this->scope;
    SVar17 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    pDVar8 = Scope::addDiag(this_00,(DiagCode)0x9d0006,SVar17);
    pDVar8 = Diagnostic::operator<<(pDVar8,(port->super_Symbol).name);
    Diagnostic::addNote(pDVar8,(DiagCode)0x50001,(port->super_Symbol).location);
  }
  else {
    SVar17 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    pDVar8 = ASTContext::addDiag(context,(DiagCode)0x540006,SVar17);
    Symbol::getHierarchicalPath_abi_cxx11_((string *)local_d0,&this_02->super_Symbol);
    pDVar9 = Diagnostic::operator<<(pDVar8,(string *)local_d0);
    Diagnostic::operator<<(pDVar9,(port->interfaceDef->super_Symbol).name);
    if (local_d0._0_8_ != (long)local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,(size_t)(local_d0._16_8_ + 1));
    }
    Diagnostic::addNote(pDVar8,(DiagCode)0x50001,(port->super_Symbol).location);
  }
LAB_0037d161:
  (__return_storage_ptr__->first).first = (Symbol *)0x0;
  (__return_storage_ptr__->first).second = (ModportSymbol *)0x0;
  __return_storage_ptr__->second = (Expression *)0x0;
LAB_0037d16f:
  if (local_68.data_ != (pointer)local_68.firstElement) {
    operator_delete(local_68.data_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<PortConnection::IfaceConn, const Expression*> getInterfaceConn(
        ASTContext& context, const InterfacePortSymbol& port, const ExpressionSyntax& syntax) {
        SLANG_ASSERT(!port.isInvalid());

        auto makeError = []() -> std::pair<PortConnection::IfaceConn, const Expression*> {
            return {{nullptr, nullptr}, nullptr};
        };

        auto portDims = port.getDeclaredRange();
        if (!portDims)
            return makeError();

        auto expr = Expression::tryBindInterfaceRef(context, syntax,
                                                    /* isInterfacePort */ true);
        if (!expr || expr->bad())
            return makeError();

        // Pull out the expression type, which should always be a virtual interface or
        // array of such types, and decompose into dims and interface info.
        SmallVector<ConstantRange, 4> dims;
        auto type = expr->type;
        while (type->isUnpackedArray()) {
            dims.push_back(type->getFixedRange());
            type = type->getArrayElementType();
        }

        auto& vit = type->as<VirtualInterfaceType>();
        auto& connDef = vit.iface.getDefinition();

        SLANG_ASSERT(vit.isRealIface);
        SLANG_ASSERT(port.isGeneric || port.interfaceDef);
        if (&connDef != port.interfaceDef && !port.isGeneric) {
            auto& diag = context.addDiag(diag::InterfacePortTypeMismatch, syntax.sourceRange());
            diag << connDef.getHierarchicalPath() << port.interfaceDef->name;
            diag.addNote(diag::NoteDeclarationHere, port.location);
            return makeError();
        }

        // Modport must match the specified requirement, if we have one.
        auto modport = vit.modport;
        if (!port.modport.empty()) {
            if (modport && modport->name != port.modport) {
                auto& diag = context.addDiag(diag::ModportConnMismatch, syntax.sourceRange());
                diag << connDef.name << modport->name;
                diag << (port.isGeneric ? "interface"sv : port.interfaceDef->name);
                diag << port.modport;
                return makeError();
            }

            auto sym = port.getModport(context, vit.iface, syntax);
            if (!sym)
                return makeError();

            modport = sym;
        }

        auto makeResult =
            [&](const Symbol* symbol) -> std::pair<PortConnection::IfaceConn, const Expression*> {
            return {{rewireIfaceArrayIndices(symbol, port.name, port.location, *portDims), modport},
                    expr};
        };

        // Make the connection if the dimensions match exactly what the port is expecting.
        const Symbol* symbol = expr->as<ArbitrarySymbolExpression>().symbol;
        if (areDimSizesEqual(*portDims, dims))
            return makeResult(symbol);

        // Otherwise, if the instance being instantiated is part of an array of instances *and*
        // the symbol we're connecting to is an array of interfaces, we need to check to see whether
        // to slice up that array among all the instances. We do the slicing operation if:
        // instance array dimensions + port dimensions == connection dimensions
        std::span<const ConstantRange> dimSpan = dims;
        if (dimSpan.size() >= instanceDims.size() &&
            areDimSizesEqual(dimSpan.subspan(0, instanceDims.size()), instanceDims) &&
            areDimSizesEqual(dimSpan.subspan(instanceDims.size()), *portDims)) {

            // It's ok to do the slicing, so pick the correct slice for the connection
            // based on the actual path of the instance we're elaborating.
            for (size_t i = 0; i < instance.arrayPath.size(); i++) {
                // We want to match left index to left index, so if the dimensions
                // are in reversed order we need to reverse our index here.
                auto& array = symbol->as<InstanceArraySymbol>();
                size_t index = instance.arrayPath[i];
                if (instanceDims[i].isLittleEndian() != array.range.isLittleEndian())
                    index = array.elements.size() - index - 1;

                symbol = array.elements[index];
            }

            return makeResult(symbol);
        }

        auto& diag = scope.addDiag(diag::PortConnDimensionsMismatch, syntax.sourceRange())
                     << port.name;
        diag.addNote(diag::NoteDeclarationHere, port.location);
        return makeError();
    }